

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cpp
# Opt level: O0

bool __thiscall gpu::Device::printInfo(Device *this)

{
  bool bVar1;
  undefined1 local_130 [8];
  DeviceInfo device_info;
  Device *this_local;
  
  bVar1 = (this->supports_opencl & 1U) != 0;
  if (bVar1) {
    device_info.extensions._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
    ocl::DeviceInfo::DeviceInfo((DeviceInfo *)local_130);
    ocl::DeviceInfo::init((DeviceInfo *)local_130,(EVP_PKEY_CTX *)this->device_id_opencl);
    ocl::DeviceInfo::print((DeviceInfo *)local_130);
    ocl::DeviceInfo::~DeviceInfo((DeviceInfo *)local_130);
  }
  return bVar1;
}

Assistant:

bool Device::printInfo() const
{
#ifdef CUDA_SUPPORT
	if (supports_cuda) {
		return CUDAEnum::printInfo(device_id_cuda);
	}
#endif

	if (supports_opencl) {
		ocl::DeviceInfo device_info;
		device_info.init(device_id_opencl);
		device_info.print();
		return true;
	}

	return false;
}